

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  ArrayPtr<const_unsigned_char> prefix_00;
  Plausibility PVar1;
  Type *in_RCX;
  Type *in_R8;
  undefined1 local_5a [2];
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38)>
  local_58;
  Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)> local_48
  ;
  CompilerMain *local_38;
  uchar *puStack_30;
  undefined8 local_20;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  puStack_30 = (uchar *)prefix.size_;
  local_38 = (CompilerMain *)prefix.ptr;
  local_20 = this;
  this_local = local_38;
  prefix_local.ptr = puStack_30;
  local_58.t = (CompilerMain *)
               kj::_::
               boundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_2_>
                         ((BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38)>
                           *)this,(_ *)(local_5a + 1),(CompilerMain *)local_5a,in_RCX,in_R8);
  kj::Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>
              *)&local_48,&local_58);
  prefix_00.size_ = (size_t)puStack_30;
  prefix_00.ptr = (uchar *)local_38;
  PVar1 = isPlausiblyPacked(this,prefix_00,&local_48);
  kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::
  ~Function(&local_48);
  return PVar1;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix) {
    return isPlausiblyPacked(prefix, KJ_BIND_METHOD(*this, isPlausiblyBinary));
  }